

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpFactory.cpp
# Opt level: O1

void __thiscall xercesc_4_0::OpFactory::OpFactory(OpFactory *this,MemoryManager *manager)

{
  MemoryManager *pMVar1;
  int iVar2;
  XMLSize_t index;
  RefVectorOf<xercesc_4_0::Op> *pRVar3;
  undefined4 extraout_var;
  long lVar4;
  
  this->fOpVector = (RefVectorOf<xercesc_4_0::Op> *)0x0;
  this->fMemoryManager = manager;
  pRVar3 = (RefVectorOf<xercesc_4_0::Op> *)XMemory::operator_new(0x30,manager);
  pMVar1 = this->fMemoryManager;
  (pRVar3->super_BaseRefVectorOf<xercesc_4_0::Op>)._vptr_BaseRefVectorOf =
       (_func_int **)&PTR__BaseRefVectorOf_0040bd08;
  (pRVar3->super_BaseRefVectorOf<xercesc_4_0::Op>).fAdoptedElems = true;
  (pRVar3->super_BaseRefVectorOf<xercesc_4_0::Op>).fCurCount = 0;
  (pRVar3->super_BaseRefVectorOf<xercesc_4_0::Op>).fMaxCount = 0x10;
  (pRVar3->super_BaseRefVectorOf<xercesc_4_0::Op>).fElemList = (Op **)0x0;
  (pRVar3->super_BaseRefVectorOf<xercesc_4_0::Op>).fMemoryManager = pMVar1;
  iVar2 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0x80);
  (pRVar3->super_BaseRefVectorOf<xercesc_4_0::Op>).fElemList = (Op **)CONCAT44(extraout_var,iVar2);
  lVar4 = 0;
  do {
    (pRVar3->super_BaseRefVectorOf<xercesc_4_0::Op>).fElemList[lVar4] = (Op *)0x0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  (pRVar3->super_BaseRefVectorOf<xercesc_4_0::Op>)._vptr_BaseRefVectorOf =
       (_func_int **)&PTR__RefVectorOf_0040bc90;
  this->fOpVector = pRVar3;
  return;
}

Assistant:

OpFactory::OpFactory(MemoryManager* const manager) :
    fOpVector(0)
    , fMemoryManager(manager)
{
    fOpVector = new (fMemoryManager) RefVectorOf<Op>(16, true, fMemoryManager);
}